

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawIndexedIndirect
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawIndexedIndirectAttribs *Attribs
          ,int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char *in_R8;
  char (*in_R9) [8];
  PipelineStateVkImpl *pPVar4;
  string msg;
  string local_60;
  String local_40;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    CVar2 = (this->m_Desc).QueueType;
    if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_60,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x93e);
        std::__cxx11::string::~string((string *)&local_60);
      }
      FormatString<char[97]>
                (&local_60,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x93e);
      std::__cxx11::string::~string((string *)&local_60);
      CVar2 = (this->m_Desc).QueueType;
      Type = extraout_DL;
    }
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[20],char[22],std::__cxx11::string,char[8]>
                (&local_60,(Diligent *)0x6e9f49,(char (*) [20])0x7e8bba,(char (*) [22])&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_40);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x93e);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((Attribs->pCounterBuffer != (IBuffer *)0x0) &&
       (((((this->m_pDevice).m_pObject)->
         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.DrawCommand.CapFlags &
        DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) == DRAW_COMMAND_CAP_FLAG_NONE)) {
      FormatString<char[137]>
                (&local_60,
                 (char (*) [137])
                 "DrawIndexedIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x941);
      std::__cxx11::string::~string((string *)&local_60);
    }
    pPVar4 = (this->m_pPipelineState).m_pObject;
    if (pPVar4 == (PipelineStateVkImpl *)0x0) {
      FormatString<char[79]>
                (&local_60,
                 (char (*) [79])
                 "DrawIndexedIndirect command arguments are invalid: no pipeline state is bound.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x944);
      std::__cxx11::string::~string((string *)&local_60);
      pPVar4 = (this->m_pPipelineState).m_pObject;
    }
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar4 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[68],char_const*,char[30]>
                (&local_60,
                 (Diligent *)"DrawIndexedIndirect command arguments are invalid: pipeline state \'",
                 (char (*) [68])
                 &(pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a graphics pipeline.",(char (*) [30])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x948);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((this->m_pIndexBuffer).m_pObject == (BufferVkImpl *)0x0) {
      FormatString<char[77]>
                (&local_60,
                 (char (*) [77])
                 "DrawIndexedIndirect command arguments are invalid: no index buffer is bound.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x94a);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) &&
       (Attribs->AttribsBufferStateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)) {
      FormatString<char[188]>
                (&local_60,
                 (char (*) [188])
                 "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x94e);
      std::__cxx11::string::~string((string *)&local_60);
    }
    bVar3 = VerifyDrawIndexedIndirectAttribs(Attribs);
    if (!bVar3) {
      FormatString<char[39]>(&local_60,(char (*) [39])"DrawIndexedIndirectAttribs are invalid");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawIndexedIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x950);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawIndexedIndirect;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawIndexedIndirect(const DrawIndexedIndirectAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawIndexedIndirect");

        DEV_CHECK_ERR(Attribs.pCounterBuffer == nullptr || (m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) != 0,
                      "DrawIndexedIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability");
        // There is no need to check DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT because an indirect buffer can only be created if this capability is supported.

        DEV_CHECK_ERR(m_pPipelineState, "DrawIndexedIndirect command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "DrawIndexedIndirect command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(m_pIndexBuffer, "DrawIndexedIndirect command arguments are invalid: no index buffer is bound.");

        DEV_CHECK_ERR(m_pActiveRenderPass == nullptr || Attribs.AttribsBufferStateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION,
                      "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                      "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

        DEV_CHECK_ERR(VerifyDrawIndexedIndirectAttribs(Attribs), "DrawIndexedIndirectAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawIndexedIndirect;
}